

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

uint64_t hash_string(char *string,size_t length)

{
  ulong uVar1;
  size_t sVar2;
  uchar *str;
  
  if (length != 0) {
    sVar2 = 0;
    uVar1 = 0;
    do {
      uVar1 = (ulong)(byte)string[sVar2] ^ uVar1 * 0x100000001b3;
      sVar2 = sVar2 + 1;
    } while (length != sVar2);
    return uVar1;
  }
  return 0;
}

Assistant:

uint64_t hash_string(char *string, size_t length) {
	// Convert to an unsigned string
	unsigned char *str = (unsigned char *) string;

	// Hash each byte of the string
	uint64_t hash = 0;
	for (size_t i = 0; i < length; i++) {
		// Multiply by the magic prime, modulo 2^64 from integer overflow
		hash *= FNV_64_PRIME;

		// XOR the lowest byte of the hash with the current octet
		hash ^= (uint64_t) *str++;
	}

	return hash;
}